

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglTestPackage.cpp
# Opt level: O1

int __thiscall deqp::egl::FunctionalTests::init(FunctionalTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestCaseGroup *pTVar2;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  CreateContextTests::CreateContextTests
            ((CreateContextTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  QueryContextTests::QueryContextTests
            ((QueryContextTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  CreateSurfaceTests::CreateSurfaceTests
            ((CreateSurfaceTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  QuerySurfaceTests::QuerySurfaceTests
            ((QuerySurfaceTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  QueryConfigTests::QueryConfigTests
            ((QueryConfigTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ChooseConfigTests::ChooseConfigTests
            ((ChooseConfigTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ColorClearTests::ColorClearTests
            ((ColorClearTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  RenderTests::RenderTests((RenderTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ImageTests::ImageTests((ImageTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SharingTests::SharingTests((SharingTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NegativeApiTests::NegativeApiTests
            ((NegativeApiTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FenceSyncTests::FenceSyncTests((FenceSyncTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiThreadedTests::MultiThreadedTests
            ((MultiThreadedTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  GetProcAddressTests::GetProcAddressTests
            ((GetProcAddressTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  PreservingSwapTests::PreservingSwapTests
            ((PreservingSwapTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ClientExtensionTests::ClientExtensionTests
            ((ClientExtensionTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  CreateContextExtTests::CreateContextExtTests
            ((CreateContextExtTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SurfacelessContextTests::SurfacelessContextTests
            ((SurfacelessContextTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SwapBuffersTests::SwapBuffersTests
            ((SwapBuffersTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NativeColorMappingTests::NativeColorMappingTests
            ((NativeColorMappingTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NativeCoordMappingTests::NativeCoordMappingTests
            ((NativeCoordMappingTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ReusableSyncTests::ReusableSyncTests
            ((ReusableSyncTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ResizeTests::ResizeTests((ResizeTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferAgeTests::BufferAgeTests((BufferAgeTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  PartialUpdateTests::PartialUpdateTests
            ((PartialUpdateTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NegativePartialUpdateTests::NegativePartialUpdateTests
            ((NegativePartialUpdateTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SwapBuffersWithDamageTests::SwapBuffersWithDamageTests
            ((SwapBuffersWithDamageTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = createMultiContextTests((this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = createThreadCleanUpTest((this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar1 = (TestNode *)operator_new(0x78);
  MutableRenderBufferTests::MutableRenderBufferTests
            ((MutableRenderBufferTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = createGetFrameTimestampsTests((this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = createRobustnessTests((this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new CreateContextTests			(m_eglTestCtx));
		addChild(new QueryContextTests			(m_eglTestCtx));
		addChild(new CreateSurfaceTests			(m_eglTestCtx));
		addChild(new QuerySurfaceTests			(m_eglTestCtx));
		addChild(new QueryConfigTests			(m_eglTestCtx));
		addChild(new ChooseConfigTests			(m_eglTestCtx));
		addChild(new ColorClearTests			(m_eglTestCtx));
		addChild(new RenderTests				(m_eglTestCtx));
		addChild(new ImageTests					(m_eglTestCtx));
		addChild(new SharingTests				(m_eglTestCtx));
		addChild(new NegativeApiTests			(m_eglTestCtx));
		addChild(new FenceSyncTests				(m_eglTestCtx));
		addChild(new MultiThreadedTests			(m_eglTestCtx));
		addChild(new GetProcAddressTests		(m_eglTestCtx));
		addChild(new PreservingSwapTests		(m_eglTestCtx));
		addChild(new ClientExtensionTests		(m_eglTestCtx));
		addChild(new CreateContextExtTests		(m_eglTestCtx));
		addChild(new SurfacelessContextTests	(m_eglTestCtx));
		addChild(new SwapBuffersTests			(m_eglTestCtx));
		addChild(new NativeColorMappingTests	(m_eglTestCtx));
		addChild(new NativeCoordMappingTests	(m_eglTestCtx));
		addChild(new ReusableSyncTests			(m_eglTestCtx));
		addChild(new ResizeTests				(m_eglTestCtx));
		addChild(new BufferAgeTests				(m_eglTestCtx));
		addChild(new PartialUpdateTests			(m_eglTestCtx));
		addChild(new NegativePartialUpdateTests	(m_eglTestCtx));
		addChild(new SwapBuffersWithDamageTests	(m_eglTestCtx));
		addChild(createMultiContextTests		(m_eglTestCtx));
		addChild(createThreadCleanUpTest		(m_eglTestCtx));
		addChild(new MutableRenderBufferTests	(m_eglTestCtx));
		addChild(createGetFrameTimestampsTests	(m_eglTestCtx));
		addChild(createRobustnessTests			(m_eglTestCtx));
	}